

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

bool __thiscall FIX::Session::doTargetTooLow(Session *this,Message *msg)

{
  bool bVar1;
  FieldBase *pFVar2;
  ostream *poVar3;
  logic_error *this_00;
  PossDupFlag possDupFlag;
  stringstream stream;
  string local_228;
  FieldBase local_208;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  BoolField::BoolField((BoolField *)&local_208,0x2b,false);
  local_208._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f7090;
  FieldMap::getFieldIfSet(&(msg->m_header).super_FieldMap,&local_208);
  pFVar2 = FieldMap::getFieldRef(&(msg->m_header).super_FieldMap,0x22);
  bVar1 = BoolField::getValue((BoolField *)&local_208);
  if (bVar1) {
    bVar1 = doPossDup(this,msg);
    FieldBase::~FieldBase(&local_208);
    return bVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"MsgSeqNum too low, expecting ",0x1d)
  ;
  SessionState::getNextTargetMsgSeqNum(&this->m_state);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," but received ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(pFVar2->m_string)._M_dataplus._M_p,(pFVar2->m_string)._M_string_length);
  std::__cxx11::stringbuf::str();
  generateLogout(this,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,(string *)&local_228);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool Session::doTargetTooLow(const Message &msg) {
  const Header &header = msg.getHeader();
  PossDupFlag possDupFlag(false);
  header.getFieldIfSet(possDupFlag);
  auto const &msgSeqNum = header.getField<MsgSeqNum>();

  if (!possDupFlag) {
    std::stringstream stream;
    stream << "MsgSeqNum too low, expecting " << getExpectedTargetNum() << " but received " << msgSeqNum;
    generateLogout(stream.str());
    throw std::logic_error(stream.str());
  }

  return doPossDup(msg);
}